

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,char **pointer)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long *in_RSI;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  
  if (*in_RSI == 0) {
    pbVar1 = internal::
             scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(in_RDI);
    std::operator<<((ostream *)(pbVar1 + 0x10),"(null)");
  }
  else {
    pbVar1 = internal::
             scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(in_RDI);
    std::operator<<((ostream *)(pbVar1 + 0x10),(char *)*in_RSI);
  }
  return (Message *)in_RDI;
}

Assistant:

inline Message& operator <<(T* const& pointer) {  // NOLINT
    if (pointer == NULL) {
      *ss_ << "(null)";
    } else {
      *ss_ << pointer;
    }
    return *this;
  }